

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock-matchers.h
# Opt level: O3

Message __thiscall
testing::internal::UnorderedElementsAreMatcherImplBase::Elements
          (UnorderedElementsAreMatcherImplBase *this,size_t n)

{
  bool bVar1;
  char *pcVar2;
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_20;
  
  Message::Message((Message *)&local_20);
  std::ostream::_M_insert<unsigned_long>((ulong)(local_20.ptr_ + 0x10));
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)(local_20.ptr_ + 0x10)," element",8)
  ;
  pcVar2 = "";
  if (n != 1) {
    pcVar2 = "s";
  }
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)(local_20.ptr_ + 0x10),pcVar2,(ulong)(n != 1));
  Message::Message((Message *)this,(Message *)&local_20);
  if (local_20.ptr_ !=
      (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    bVar1 = IsTrue(true);
    if ((bVar1) &&
       (local_20.ptr_ !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
      (**(code **)(*(long *)local_20.ptr_ + 8))();
    }
  }
  return (Message)(scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   )this;
}

Assistant:

static Message Elements(size_t n) {
    return Message() << n << " element" << (n == 1 ? "" : "s");
  }